

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0853(ParserTester *this)

{
  ParseOptions parseOpts;
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  ParseOptions local_220;
  allocator<psy::C::SyntaxKind> local_1f9;
  SyntaxKind local_1f8 [12];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"x y [ ] = { [ 1 ] = 1 } ;",&local_31);
  Expectation::Expectation(&local_1b8);
  local_1f8[0] = STARTof_Node;
  local_1f8[1] = VariableAndOrFunctionDeclaration;
  local_1f8[2] = TypedefName;
  local_1f8[3] = ArrayDeclarator;
  local_1f8[4] = IdentifierDeclarator;
  local_1f8[5] = SubscriptSuffix;
  local_1f8[6] = BraceEnclosedInitializer;
  local_1f8[7] = DesignatedInitializer;
  local_1f8[8] = ArrayDesignator;
  local_1f8[9] = IntegerConstantExpression;
  local_1f8[10] = ExpressionInitializer;
  local_1f8[0xb] = IntegerConstantExpression;
  local_1e0 = local_1f8;
  local_1d8 = 0xc;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_1f9);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_1f9);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions(&local_220);
  parseOpts.langExts_.translations_.field_0 = local_220.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_220.langDialect_.std_;
  parseOpts._1_7_ = local_220._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_220.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_220.field_2;
  parseOpts._26_6_ = local_220._26_6_;
  parse(this,&local_30,&local_100,Any,parseOpts);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_1f9);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case0853()
{
    parse("x y [ ] = { [ 1 ] = 1 } ;",
          Expectation().AST( { SyntaxKind::TranslationUnit,
                               SyntaxKind::VariableAndOrFunctionDeclaration,
                               SyntaxKind::TypedefName,
                               SyntaxKind::ArrayDeclarator,
                               SyntaxKind::IdentifierDeclarator,
                               SyntaxKind::SubscriptSuffix,
                               SyntaxKind::BraceEnclosedInitializer,
                               SyntaxKind::DesignatedInitializer,
                               SyntaxKind::ArrayDesignator,
                               SyntaxKind::IntegerConstantExpression,
                               SyntaxKind::ExpressionInitializer,
                               SyntaxKind::IntegerConstantExpression }));
}